

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  size_t sVar3;
  ostream local_550 [8];
  ofstream fout;
  undefined1 local_350 [8];
  Module nasmModule;
  ofstream dumpIR;
  allocator<char> local_f9;
  string local_f8 [8];
  string irPath;
  Stats stats;
  string local_c8;
  undefined1 local_a8 [8];
  Module irModule;
  allocator<char> local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  int local_20;
  byte local_19;
  int i;
  bool semanticOnly;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  local_19 = 0;
  _i = argv;
  argv_local._0_4_ = argc;
  for (local_20 = 0; local_20 < (int)argv_local; local_20 = local_20 + 1) {
    pcVar1 = _i[local_20];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,pcVar1,&local_41);
    bVar2 = std::operator==(&local_40,"--semantic");
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    if (bVar2) {
      local_19 = 1;
    }
  }
  pcVar1 = _i[1];
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,pcVar1,(allocator<char> *)((long)&stats.module + 7));
  runFrontend((Module *)local_a8,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&stats.module + 7));
  if ((local_19 & 1) == 0) {
    mocker::ir::Stats::Stats((Stats *)((long)&irPath.field_2 + 8),(Module *)local_a8);
    sVar3 = mocker::ir::Stats::countInsts<mocker::ir::Phi>((Stats *)((long)&irPath.field_2 + 8));
    if (sVar3 != 0) {
      __assert_fail("stats.countInsts<mocker::ir::Phi>() == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/main.cpp"
                    ,0x41,"int main(int, char **)");
    }
    optimize((Module *)local_a8);
    if (2 < (int)argv_local) {
      pcVar1 = _i[2];
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_f8,pcVar1,&local_f9);
      std::allocator<char>::~allocator(&local_f9);
      std::ofstream::ofstream(&nasmModule.sections._M_h._M_single_bucket,local_f8,0x10);
      mocker::ir::printModule
                ((Module *)local_a8,(ostream *)&nasmModule.sections._M_h._M_single_bucket);
      std::ofstream::~ofstream(&nasmModule.sections._M_h._M_single_bucket);
      std::__cxx11::string::~string(local_f8);
    }
    codegen((Module *)local_350,(Module *)local_a8);
    if ((int)argv_local < 4) {
      mocker::nasm::printModule((Module *)local_350,(ostream *)&std::cout);
    }
    else {
      std::ofstream::ofstream(local_550,_i[3],0x10);
      mocker::nasm::printModule((Module *)local_350,local_550);
      std::ofstream::close();
      std::ofstream::~ofstream(local_550);
    }
    argv_local._4_4_ = 0;
    stats.module._0_4_ = 1;
    mocker::nasm::Module::~Module((Module *)local_350);
  }
  else {
    argv_local._4_4_ = 0;
    stats.module._0_4_ = 1;
  }
  mocker::ir::Module::~Module((Module *)local_a8);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv) {
  bool semanticOnly = false;
  for (int i = 0; i < argc; ++i) {
    if (std::string(argv[i]) == "--semantic")
      semanticOnly = true;
  }

  auto irModule = runFrontend(argv[1]);

  if (semanticOnly)
    return 0;

  mocker::ir::Stats stats(irModule);
  assert(stats.countInsts<mocker::ir::Phi>() == 0);

  optimize(irModule);

  if (argc >= 3) {
    std::string irPath = argv[2];
    std::ofstream dumpIR(irPath);
    mocker::ir::printModule(irModule, dumpIR);
  }

  auto nasmModule = codegen(irModule);
  if (argc >= 4) {
    std::ofstream fout(argv[3]);
    mocker::nasm::printModule(nasmModule, fout);
    fout.close();
  } else {
    mocker::nasm::printModule(nasmModule, std::cout);
  }

  return 0;
}